

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O2

Vector3f __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForEntryId
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,int entry_id)

{
  GeometryAttribute *this_00;
  int in_EDX;
  undefined4 in_register_00000034;
  AttributeValueIndex att_index;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector3f VVar1;
  
  att_index.value_ =
       *(uint *)(*(long *)(CONCAT44(in_register_00000034,entry_id) + 0x68) + (long)in_EDX * 4);
  VectorD<float,_3>::VectorD((VectorD<float,_3> *)this);
  this_00 = *(GeometryAttribute **)(CONCAT44(in_register_00000034,entry_id) + 0x60);
  if (this_00[1].field_0x24 == '\0') {
    att_index.value_ =
         *(uint *)(this_00[1].buffer_descriptor_.buffer_id + (ulong)att_index.value_ * 4);
  }
  GeometryAttribute::ConvertValue<float>(this_00,att_index,(float *)this);
  VVar1.v_._M_elems[2] = in_XMM1_Da;
  VVar1.v_._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  VVar1.v_._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector3f)VVar1.v_._M_elems;
}

Assistant:

Vector3f GetPositionForEntryId(int entry_id) const {
    const PointIndex point_id = entry_to_point_id_map_[entry_id];
    Vector3f pos;
    pos_attribute_->ConvertValue(pos_attribute_->mapped_index(point_id),
                                 &pos[0]);
    return pos;
  }